

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::MarkItemEdited(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  byte local_19;
  ImGuiContext *g;
  ImGuiID id_local;
  
  pIVar2 = GImGui;
  local_19 = 1;
  if ((GImGui->ActiveId != id) && (local_19 = 1, GImGui->ActiveId != 0)) {
    local_19 = GImGui->DragDropActive;
  }
  if ((local_19 & 1) == 0) {
    __assert_fail("g.ActiveId == id || g.ActiveId == 0 || g.DragDropActive",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/imgui/imgui.cpp"
                  ,0xb0c,"void ImGui::MarkItemEdited(ImGuiID)");
  }
  GImGui->ActiveIdHasBeenEditedThisFrame = true;
  pIVar2->ActiveIdHasBeenEditedBefore = true;
  pIVar1 = pIVar2->CurrentWindow;
  (pIVar1->DC).LastItemStatusFlags = (pIVar1->DC).LastItemStatusFlags | 4;
  return;
}

Assistant:

void ImGui::MarkItemEdited(ImGuiID id)
{
    // This marking is solely to be able to provide info for IsItemDeactivatedAfterEdit().
    // ActiveId might have been released by the time we call this (as in the typical press/release button behavior) but still need need to fill the data.
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == id || g.ActiveId == 0 || g.DragDropActive);
    IM_UNUSED(id); // Avoid unused variable warnings when asserts are compiled out.
    //IM_ASSERT(g.CurrentWindow->DC.LastItemId == id);
    g.ActiveIdHasBeenEditedThisFrame = true;
    g.ActiveIdHasBeenEditedBefore = true;
    g.CurrentWindow->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_Edited;
}